

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_common.h
# Opt level: O0

void uc_common_init(uc_struct_conflict15 *uc)

{
  uc_struct_conflict15 *uc_local;
  
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_tricore = tcg_exec_init_tricore;
  uc->cpu_exec_init_all_tricore = cpu_exec_init_all_tricore;
  uc->vm_start_tricore = vm_start_tricore;
  uc->memory_map_tricore = memory_map_tricore;
  uc->memory_map_ptr_tricore = memory_map_ptr_tricore;
  uc->memory_unmap_tricore = memory_unmap_tricore;
  uc->memory_moveout_tricore = memory_moveout_tricore;
  uc->memory_movein_tricore = memory_movein_tricore;
  uc->readonly_mem = memory_region_set_readonly_tricore;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_tricore;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_tricore;
  uc->memory_map_io_tricore = memory_map_io_tricore;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_tricore;
  uc->memory_filter_subregions = memory_region_filter_subregions_tricore;
  uc->memory_cow_tricore = memory_cow_tricore;
  if (uc->release == (uc_args_void_t)0x0) {
    uc->release = release_common;
  }
  return;
}

Assistant:

static inline void uc_common_init(struct uc_struct* uc)
{
    uc->write_mem = cpu_physical_mem_write;
    uc->read_mem = cpu_physical_mem_read;
    uc->tcg_exec_init = tcg_exec_init;
    uc->cpu_exec_init_all = cpu_exec_init_all;
    uc->vm_start = vm_start;
    uc->memory_map = memory_map;
    uc->memory_map_ptr = memory_map_ptr;
    uc->memory_unmap = memory_unmap;
    uc->memory_moveout = memory_moveout;
    uc->memory_movein = memory_movein;
    uc->readonly_mem = memory_region_set_readonly;
    uc->target_page = target_page_init;
    uc->softfloat_initialize = softfloat_init;
    uc->tcg_flush_tlb = tcg_flush_softmmu_tlb;
    uc->memory_map_io = memory_map_io;
    uc->set_tlb = uc_set_tlb;
    uc->memory_mapping = find_memory_mapping;
    uc->memory_filter_subregions = memory_region_filter_subregions;
    uc->memory_cow = memory_cow;

    if (!uc->release)
        uc->release = release_common;
}